

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O1

void __thiscall chrono::fea::ChLinkPointFrame::ConstraintsLoadJacobians(ChLinkPointFrame *this)

{
  ChConstraintTwoGeneric *this_00;
  ChConstraintTwoGeneric *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  element_type *peVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  Index index;
  ulong uVar13;
  ulong uVar14;
  ChConstraintTwoGeneric *this_02;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> Jxb;
  ChMatrix33<double> Jxn;
  ChMatrix33<double> Jrb;
  ChStarMatrix33<double> atilde;
  ChMatrix33<double> Arw;
  ChMatrix33<double> Aow;
  ChMatrix33<double> Aro;
  assign_op<double,_double> local_271;
  SrcEvaluatorType local_270;
  plainobjectbase_evaluator_data<double,_3> local_248;
  ChMatrix33<double> local_240;
  ChMatrix33<double> local_1f8;
  DstXprType local_1b0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_168;
  ChMatrix33<double> *local_148;
  undefined8 local_140;
  undefined8 local_138;
  ulong local_130;
  undefined8 local_128;
  ulong local_120;
  ulong uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  ChMatrix33<double> local_100;
  ChMatrix33<double> local_b8;
  undefined1 local_70 [72];
  
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_70,&(this->m_csys).rot);
  ChMatrix33<double>::ChMatrix33
            (&local_b8,
             &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_b8;
  local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_70;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_100,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_1f8);
  local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_100;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_1f8,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_240);
  local_148 = &local_100;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>>
            (&local_240,
             (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_148);
  peVar7 = (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar8 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  dVar9 = *(double *)&(peVar7->super_ChNodeFEAbase).field_0x20 -
          (peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar10 = *(double *)&peVar7->field_0x28 -
           *(double *)
            ((long)(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data + 8)
  ;
  dVar11 = *(double *)&peVar7->field_0x30 -
           *(double *)
            ((long)(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data +
            0x10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar9;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       dVar10 * local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar1 = vfmadd231sd_fma(auVar21,auVar15,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar11;
  auVar2 = vfmadd231sd_fma(auVar1,auVar18,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       dVar10 * local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar1 = vfmadd231sd_fma(auVar22,auVar15,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar1 = vfmadd231sd_fma(auVar1,auVar18,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar9;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar10 * local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar3 = vfmadd231sd_fma(auVar17,auVar16,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar11;
  auVar3 = vfmadd231sd_fma(auVar3,auVar19,auVar6);
  local_148 = (ChMatrix33<double> *)0x0;
  local_130 = auVar3._0_8_;
  auVar20._0_8_ = local_130 ^ 0x8000000000000000;
  auVar20._8_8_ = auVar3._8_8_ ^ 0x8000000000000000;
  local_140 = vmovlpd_avx(auVar20);
  local_138 = auVar1._0_8_;
  local_128 = 0;
  auVar1 = vunpcklpd_avx(auVar2,auVar1);
  local_120 = auVar1._0_8_ ^ 0x8000000000000000;
  uStack_118 = auVar1._8_8_ ^ 0x8000000000000000;
  local_110 = auVar2._0_8_;
  local_108 = 0;
  local_168.m_src = &local_270;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_248.data = (double *)&local_1b0;
  local_168.m_dst = (DstEvaluatorType *)&local_248;
  local_168.m_functor = &local_271;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.m_matrix = (non_const_type)local_70;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = (type)&local_148;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
          )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )local_70;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)&local_148;
  local_168.m_dstExpr = (DstXprType *)local_248.data;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_168);
  this_00 = &this->constraint1;
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_270,this_00);
  if (2 < (long)local_270.
                super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhsImpl.
                super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                .m_argImpl.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data) {
    uVar13 = 3;
    if ((((ulong)local_270.
                 super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs.m_matrix & 7) == 0) &&
       (uVar14 = (ulong)(-((uint)((ulong)local_270.
                                         super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                         .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7), uVar14 < 3)) {
      uVar13 = uVar14;
    }
    if (uVar13 != 0) {
      uVar14 = 0;
      do {
        ((plain_array<double,_9,_1,_0> *)
        ((local_270.
          super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
        m_data.array)->array[uVar14] =
             local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    if (uVar13 < 3) {
      do {
        ((plain_array<double,_9,_1,_0> *)
        ((local_270.
          super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
        m_data.array)->array[uVar13] =
             local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar13 != 3);
    }
    this_01 = &this->constraint2;
    ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_270,this_01);
    if (2 < (long)local_270.
                  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhsImpl.
                  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                  .m_argImpl.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.
                  m_d.data) {
      uVar13 = 3;
      if ((((ulong)local_270.
                   super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhs.m_matrix & 7) == 0) &&
         (uVar14 = (ulong)(-((uint)((ulong)local_270.
                                           super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                           .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7), uVar14 < 3)) {
        uVar13 = uVar14;
      }
      if (uVar13 != 0) {
        uVar14 = 0;
        do {
          ((plain_array<double,_9,_1,_0> *)
          ((local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
          m_storage.m_data.array)->array[uVar14] =
               *(double *)
                ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + uVar14 * 8 + 0x18);
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      if (uVar13 < 3) {
        do {
          ((plain_array<double,_9,_1,_0> *)
          ((local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
          m_storage.m_data.array)->array[uVar13] =
               *(double *)
                ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + uVar13 * 8 + 0x18);
          uVar13 = uVar13 + 1;
        } while (uVar13 != 3);
      }
      this_02 = &this->constraint3;
      ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_270,this_02);
      if (2 < (long)local_270.
                    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhsImpl.
                    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                    .m_argImpl.
                    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.
                    m_d.data) {
        uVar13 = 3;
        if ((((ulong)local_270.
                     super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     .m_lhs.m_matrix & 7) == 0) &&
           (uVar14 = (ulong)(-((uint)((ulong)local_270.
                                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7), uVar14 < 3))
        {
          uVar13 = uVar14;
        }
        if (uVar13 != 0) {
          uVar14 = 0;
          do {
            ((plain_array<double,_9,_1,_0> *)
            ((local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
            m_storage.m_data.array)->array[uVar14] =
                 *(double *)
                  ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + uVar14 * 8 + 0x30);
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        if (uVar13 < 3) {
          do {
            ((plain_array<double,_9,_1,_0> *)
            ((local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
            m_storage.m_data.array)->array[uVar13] =
                 *(double *)
                  ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + uVar13 * 8 + 0x30);
            uVar13 = uVar13 + 1;
          } while (uVar13 != 3);
        }
        ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_00);
        if (2 < (long)local_270.
                      super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                      .m_lhsImpl.
                      super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                      .m_argImpl.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      .m_d.data) {
          uVar13 = 3;
          if ((((ulong)local_270.
                       super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.m_matrix & 7) == 0) &&
             (uVar14 = (ulong)(-((uint)((ulong)local_270.
                                               super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                               .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7), uVar14 < 3)
             ) {
            uVar13 = uVar14;
          }
          if (uVar13 != 0) {
            uVar14 = 0;
            do {
              ((plain_array<double,_9,_1,_0> *)
              ((local_270.
                super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
              m_storage.m_data.array)->array[uVar14] =
                   local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
          }
          if (uVar13 < 3) {
            do {
              ((plain_array<double,_9,_1,_0> *)
              ((local_270.
                super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
              m_storage.m_data.array)->array[uVar13] =
                   local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar13 != 3);
          }
          ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_01);
          if (2 < (long)local_270.
                        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhsImpl.
                        super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                        .m_argImpl.
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        .m_d.data) {
            uVar13 = 3;
            if ((((ulong)local_270.
                         super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         .m_lhs.m_matrix & 7) == 0) &&
               (uVar14 = (ulong)(-((uint)((ulong)local_270.
                                                 super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                 .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7),
               uVar14 < 3)) {
              uVar13 = uVar14;
            }
            if (uVar13 != 0) {
              uVar14 = 0;
              do {
                ((plain_array<double,_9,_1,_0> *)
                ((local_270.
                  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                m_storage.m_data.array)->array[uVar14] =
                     *(double *)
                      ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + uVar14 * 8 + 0x18);
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            if (uVar13 < 3) {
              do {
                ((plain_array<double,_9,_1,_0> *)
                ((local_270.
                  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                m_storage.m_data.array)->array[uVar13] =
                     *(double *)
                      ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + uVar13 * 8 + 0x18);
                uVar13 = uVar13 + 1;
              } while (uVar13 != 3);
            }
            ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_02);
            if (2 < (long)local_270.
                          super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                          .m_lhsImpl.
                          super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                          .m_argImpl.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                          .m_d.data) {
              uVar13 = 3;
              if ((((ulong)local_270.
                           super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                           .m_lhs.m_matrix & 7) == 0) &&
                 (uVar14 = (ulong)(-((uint)((ulong)local_270.
                                                                                                      
                                                  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                                  .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7),
                 uVar14 < 3)) {
                uVar13 = uVar14;
              }
              if (uVar13 != 0) {
                uVar14 = 0;
                do {
                  ((plain_array<double,_9,_1,_0> *)
                  ((local_270.
                    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                  m_storage.m_data.array)->array[uVar14] =
                       *(double *)
                        ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + uVar14 * 8 + 0x30);
                  uVar14 = uVar14 + 1;
                } while (uVar13 != uVar14);
              }
              if (uVar13 < 3) {
                do {
                  ((plain_array<double,_9,_1,_0> *)
                  ((local_270.
                    super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                  m_storage.m_data.array)->array[uVar13] =
                       *(double *)
                        ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array + uVar13 * 8 + 0x30);
                  uVar13 = uVar13 + 1;
                } while (uVar13 != 3);
              }
              ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_00);
              if (5 < (long)local_270.
                            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                            .m_lhsImpl.
                            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                            .m_argImpl.
                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            .m_d.data) {
                pdVar12 = ((plain_array<double,_9,_1,_0> *)
                          ((local_270.
                            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                            .m_lhs.m_matrix)->
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                          m_data.array)->array + 3;
                uVar13 = 3;
                if ((((ulong)pdVar12 & 7) == 0) &&
                   (uVar14 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7), uVar14 < 3))
                {
                  uVar13 = uVar14;
                }
                if (uVar13 != 0) {
                  uVar14 = 0;
                  do {
                    pdVar12[uVar14] =
                         local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[uVar14];
                    uVar14 = uVar14 + 1;
                  } while (uVar13 != uVar14);
                }
                if (uVar13 < 3) {
                  do {
                    pdVar12[uVar13] =
                         local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar13 != 3);
                }
                ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_01);
                if (5 < (long)local_270.
                              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                              .m_lhsImpl.
                              super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                              .m_argImpl.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                              .m_d.data) {
                  pdVar12 = ((plain_array<double,_9,_1,_0> *)
                            ((local_270.
                              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                              .m_lhs.m_matrix)->
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
                            m_data.array)->array + 3;
                  uVar13 = 3;
                  if ((((ulong)pdVar12 & 7) == 0) &&
                     (uVar14 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7), uVar14 < 3)
                     ) {
                    uVar13 = uVar14;
                  }
                  if (uVar13 != 0) {
                    uVar14 = 0;
                    do {
                      pdVar12[uVar14] =
                           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[uVar14 + 3];
                      uVar14 = uVar14 + 1;
                    } while (uVar13 != uVar14);
                  }
                  if (uVar13 < 3) {
                    do {
                      pdVar12[uVar13] =
                           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[uVar13 + 3];
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != 3);
                  }
                  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_02);
                  if (5 < (long)local_270.
                                super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                .m_lhsImpl.
                                super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
                                .m_argImpl.
                                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                .m_d.data) {
                    pdVar12 = ((plain_array<double,_9,_1,_0> *)
                              ((local_270.
                                super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                .m_lhs.m_matrix)->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                              m_storage.m_data.array)->array + 3;
                    uVar13 = 3;
                    if ((((ulong)pdVar12 & 7) == 0) &&
                       (uVar14 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7),
                       uVar14 < 3)) {
                      uVar13 = uVar14;
                    }
                    if (uVar13 != 0) {
                      uVar14 = 0;
                      do {
                        pdVar12[uVar14] =
                             local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[uVar14 + 6];
                        uVar14 = uVar14 + 1;
                      } while (uVar13 != uVar14);
                    }
                    if (uVar13 < 3) {
                      do {
                        pdVar12[uVar13] =
                             local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[uVar13 + 6];
                        uVar13 = uVar13 + 1;
                      } while (uVar13 != 3);
                    }
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

void ChLinkPointFrame::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Aro(m_csys.rot);
    ChMatrix33<> Aow(m_body->GetRot());
    ChMatrix33<> Arw = Aow * Aro;

    ChMatrix33<> Jxn = Arw.transpose();

    ChMatrix33<> Jxb = -Arw.transpose();

    ChStarMatrix33<> atilde(Aow.transpose() * (m_node->GetPos() - m_body->GetPos()));
    ChMatrix33<> Jrb = Aro.transpose() * atilde;

    constraint1.Get_Cq_a().segment(0, 3) = Jxn.row(0);
    constraint2.Get_Cq_a().segment(0, 3) = Jxn.row(1);
    constraint3.Get_Cq_a().segment(0, 3) = Jxn.row(2);

    constraint1.Get_Cq_b().segment(0, 3) = Jxb.row(0);
    constraint2.Get_Cq_b().segment(0, 3) = Jxb.row(1);
    constraint3.Get_Cq_b().segment(0, 3) = Jxb.row(2);

    constraint1.Get_Cq_b().segment(3, 3) = Jrb.row(0);
    constraint2.Get_Cq_b().segment(3, 3) = Jrb.row(1);
    constraint3.Get_Cq_b().segment(3, 3) = Jrb.row(2);
}